

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::buildMathChildIdMap
          (ValidatorImpl *this,XmlNodePtr *node,string *infoRef,IdMap *idMap)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<libcellml::XmlNode> local_238;
  undefined1 local_228 [8];
  XmlNodePtr childNode;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  shared_ptr<libcellml::XmlNode> local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  shared_ptr<libcellml::XmlNode> local_b8;
  string local_a8;
  undefined1 local_88 [8];
  string variable;
  undefined1 local_58 [8];
  XmlAttributePtr attribute;
  string info;
  IdMap *idMap_local;
  string *infoRef_local;
  XmlNodePtr *node_local;
  ValidatorImpl *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstAttribute((XmlNode *)local_58);
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_58,(nullptr_t)0x0),
        bVar1) {
    peVar2 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    bVar1 = XmlAttribute::isType(peVar2,"id","");
    if (bVar1) {
      std::__cxx11::string::string((string *)local_88);
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      XmlNode::name_abi_cxx11_(&local_a8,peVar3);
      bVar1 = std::operator==(&local_a8,"ci");
      std::__cxx11::string::~string((string *)&local_a8);
      if (bVar1) {
        std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)node);
        XmlNode::firstChild((XmlNode *)&local_b8);
        bVar1 = std::operator!=(&local_b8,(nullptr_t)0x0);
        std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_b8);
        if (bVar1) {
          std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)node);
          XmlNode::firstChild((XmlNode *)&local_128);
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&local_128);
          XmlNode::convertToString_abi_cxx11_(&local_118,peVar3);
          std::operator+(&local_f8,"\'",&local_118);
          std::operator+(&local_d8,&local_f8,"\' ");
          std::__cxx11::string::operator=((string *)local_88,(string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_128);
        }
      }
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      XmlNode::name_abi_cxx11_(&local_1e8,peVar3);
      std::operator+(&local_1c8," - MathML ",&local_1e8);
      std::operator+(&local_1a8,&local_1c8," element ");
      std::operator+(&local_188,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_168,&local_188,"in ");
      std::operator+(&local_148,&local_168,infoRef);
      std::__cxx11::string::operator=
                ((string *)
                 &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      peVar2 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      XmlAttribute::value_abi_cxx11_(&local_208,peVar2);
      addIdMapItem(this,&local_208,
                   (string *)
                   &attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,idMap);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)local_88);
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_58);
    XmlAttribute::next((XmlAttribute *)
                       &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_58,
               (shared_ptr<libcellml::XmlAttribute> *)
               &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)local_228);
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_228,(nullptr_t)0x0), bVar1)
  {
    buildMathChildIdMap(this,(XmlNodePtr *)local_228,infoRef,idMap);
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_228);
    XmlNode::next((XmlNode *)&local_238);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)local_228,&local_238);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_238);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_228);
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::buildMathChildIdMap(const XmlNodePtr &node, const std::string &infoRef, IdMap &idMap)
{
    std::string info;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("id")) {
            std::string variable;
            if (node->name() == "ci") {
                if (node->firstChild() != nullptr) {
                    variable = "'" + node->firstChild()->convertToString() + "' ";
                }
            }
            info = " - MathML " + node->name() + " element " + variable + "in " + infoRef;
            addIdMapItem(attribute->value(), info, idMap);
        }
        attribute = attribute->next();
    }
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        buildMathChildIdMap(childNode, infoRef, idMap);
        childNode = childNode->next();
    }
}